

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.cc
# Opt level: O2

bool __thiscall draco::PointCloudEncoder::RearrangeAttributesEncoders(PointCloudEncoder *this)

{
  __uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_> _Var1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  pointer puVar6;
  pointer puVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  undefined4 uVar12;
  int p_1;
  ulong uVar13;
  _Head_base<0UL,_draco::AttributesEncoder_*,_false> _Var14;
  int ap;
  int iVar15;
  size_type __n;
  uint32_t i;
  uint32_t p;
  uint uVar16;
  reference rVar17;
  vector<int,_std::allocator<int>_> attribute_encoding_order;
  vector<bool,_std::allocator<bool>_> is_encoder_processed;
  vector<bool,_std::allocator<bool>_> is_attribute_processed;
  int local_d0;
  allocator_type local_ca;
  bool local_c9;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  undefined4 local_ac;
  ulong local_a8;
  vector<int,_std::allocator<int>_> *local_a0;
  _Vector_base<int,_std::allocator<int>_> local_98;
  _Bvector_base<std::allocator<bool>_> local_80;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  local_a0 = &this->attributes_encoder_ids_order_;
  std::vector<int,_std::allocator<int>_>::resize
            (local_a0,(long)(this->attributes_encoders_).
                            super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->attributes_encoders_).
                            super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_80,
             (long)(this->attributes_encoders_).
                   super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->attributes_encoders_).
                   super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)&local_58,
             (allocator_type *)&local_98);
  puVar6 = (this->attributes_encoders_).
           super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar7 = (this->attributes_encoders_).
           super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar9 = 0;
  do {
    if ((ulong)((long)puVar7 - (long)puVar6 >> 3) <= uVar9) {
      local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_c9 = false;
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)&local_58,
                 (long)(int)((ulong)((long)(this->point_cloud_->attributes_).
                                           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->point_cloud_->attributes_).
                                          super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3),&local_c9
                 ,&local_ca);
      uVar10 = 0;
      while( true ) {
        local_a8 = (ulong)uVar10;
        puVar6 = (this->attributes_encoders_).
                 super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar8 = (long)(this->attributes_encoders_).
                      super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6;
        uVar9 = lVar8 >> 3;
        local_ac = (undefined4)CONCAT71((int7)(lVar8 >> 0xb),uVar9 <= local_a8);
        if (uVar9 <= local_a8) break;
        iVar15 = (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[local_a8];
        _Var1._M_t.
        super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
        .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
             puVar6[iVar15]._M_t.
             super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
             ._M_t;
        uVar9 = (ulong)(*(long *)((long)_Var1._M_t.
                                        super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                        .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>.
                                        _M_head_impl + 0x10) -
                       *(long *)((long)_Var1._M_t.
                                       super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                       .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>.
                                       _M_head_impl + 8)) >> 2;
        uVar10 = (uint)uVar9;
        if (1 < (int)uVar10) {
          std::vector<int,_std::allocator<int>_>::resize
                    ((vector<int,_std::allocator<int>_> *)&local_98,(ulong)(uVar10 & 0x7fffffff));
          uVar13 = (ulong)(uVar10 & 0x7fffffff);
          local_d0 = 0;
          local_c8 = uVar13;
          local_c0 = uVar9;
          while (local_d0 < (int)local_c0) {
            local_b8 = 0;
            for (__n = 0; __n != uVar13; __n = __n + 1) {
              uVar12 = *(undefined4 *)
                        (*(long *)((long)(this->attributes_encoders_).
                                         super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[iVar15]._M_t.
                                         super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                                         ._M_t + 8) + __n * 4);
              rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)&local_58,__n);
              if ((*rVar17._M_p & rVar17._M_mask) == 0) {
                iVar3 = 0;
                do {
                  _Var1._M_t.
                  super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                  .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
                       (this->attributes_encoders_).
                       super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar15]._M_t.
                       super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                       ._M_t;
                  iVar5 = (**(code **)(*(long *)_Var1._M_t.
                                                super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                                .
                                                super__Head_base<0UL,_draco::AttributesEncoder_*,_false>
                                                ._M_head_impl + 0x30))
                                    (_Var1._M_t.
                                     super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                     .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>.
                                     _M_head_impl,uVar12);
                  if (iVar5 <= iVar3) {
                    local_98._M_impl.super__Vector_impl_data._M_start[local_d0] = (int)__n;
                    rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                       ((vector<bool,_std::allocator<bool>_> *)&local_58,__n);
                    local_d0 = local_d0 + 1;
                    *rVar17._M_p = *rVar17._M_p | rVar17._M_mask;
                    local_b8 = CONCAT71(rVar17._M_p._1_7_,1);
                    uVar13 = local_c8;
                    break;
                  }
                  _Var1._M_t.
                  super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                  .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
                       (this->attributes_encoders_).
                       super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar15]._M_t.
                       super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                       ._M_t;
                  iVar5 = (**(code **)(*(long *)_Var1._M_t.
                                                super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                                .
                                                super__Head_base<0UL,_draco::AttributesEncoder_*,_false>
                                                ._M_head_impl + 0x38))
                                    (_Var1._M_t.
                                     super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                     .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>.
                                     _M_head_impl,uVar12,iVar3);
                  rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                     ((vector<bool,_std::allocator<bool>_> *)&local_58,(long)iVar5);
                  iVar3 = iVar3 + 1;
                  uVar13 = local_c8;
                } while ((*rVar17._M_p & rVar17._M_mask) != 0);
              }
            }
            if ((local_b8 & 1) == 0 && local_d0 < (int)local_c0) goto LAB_0013b5bf;
          }
          AttributesEncoder::SetAttributeIds
                    ((AttributesEncoder *)
                     (this->attributes_encoders_).
                     super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar15]._M_t.
                     super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                     ._M_t,(vector<int,_std::allocator<int>_> *)&local_98);
        }
        uVar10 = (int)local_a8 + 1;
      }
LAB_0013b5bf:
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_98);
      uVar12 = local_ac;
      goto LAB_0013b5da;
    }
    uVar13 = 0;
    local_c0 = local_c0 & 0xffffffff00000000;
    while( true ) {
      uVar10 = (uint)uVar13;
      uVar11 = (long)puVar7 - (long)puVar6 >> 3;
      if (uVar11 <= uVar13) break;
      rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)&local_80,uVar13);
      if ((*rVar17._M_p & rVar17._M_mask) == 0) {
        local_c8 = CONCAT44(local_c8._4_4_,(int)uVar9);
        uVar16 = 0;
        bVar2 = true;
        local_b8 = uVar9;
        while( true ) {
          _Var14._M_head_impl =
               *(AttributesEncoder **)
                &(this->attributes_encoders_).
                 super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar13]._M_t.
                 super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                 ._M_t;
          if ((uint)((ulong)(*(long *)((long)_Var14._M_head_impl + 0x10) -
                            *(long *)((long)_Var14._M_head_impl + 8)) >> 2) <= uVar16) break;
          uVar12 = *(undefined4 *)(*(long *)((long)_Var14._M_head_impl + 8) + (long)(int)uVar16 * 4)
          ;
          for (iVar15 = 0;
              iVar3 = (**(code **)((long)(_Var14._M_head_impl)->_vptr_AttributesEncoder + 0x30))
                                (_Var14._M_head_impl,uVar12), iVar15 < iVar3; iVar15 = iVar15 + 1) {
            _Var1._M_t.
            super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
            .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
                 (this->attributes_encoders_).
                 super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar13]._M_t.
                 super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                 ._M_t;
            uVar4 = (**(code **)(*(long *)_Var1._M_t.
                                          super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                          .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>.
                                          _M_head_impl + 0x38))
                              (_Var1._M_t.
                               super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                               .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>.
                               _M_head_impl,uVar12,iVar15);
            if ((uVar4 != uVar10) &&
               (rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   ((vector<bool,_std::allocator<bool>_> *)&local_80,
                                    (long)(this->attribute_to_encoder_map_).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start[uVar4]),
               (*rVar17._M_p & rVar17._M_mask) == 0)) {
              bVar2 = false;
              break;
            }
            _Var14._M_head_impl =
                 *(AttributesEncoder **)
                  &(this->attributes_encoders_).
                   super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar13]._M_t.
                   super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                   ._M_t;
          }
          uVar16 = uVar16 + 1;
        }
        if (bVar2) {
          (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[local_b8] = uVar10;
          rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)&local_80,uVar13);
          uVar9 = (ulong)((int)local_c8 + 1);
          *rVar17._M_p = *rVar17._M_p | rVar17._M_mask;
          local_c0 = CONCAT44(local_c0._4_4_,(int)CONCAT71(rVar17._M_p._1_7_,1));
        }
        else {
          uVar9 = local_c8 & 0xffffffff;
        }
      }
      uVar13 = (ulong)(uVar10 + 1);
      puVar6 = (this->attributes_encoders_).
               super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar7 = (this->attributes_encoders_).
               super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
  } while ((local_c0 & 1) != 0 || uVar11 <= uVar9);
  uVar12 = 0;
LAB_0013b5da:
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_80);
  return SUB41(uVar12,0);
}

Assistant:

bool PointCloudEncoder::RearrangeAttributesEncoders() {
  // Find the encoding order of the attribute encoders that is determined by
  // the parent dependencies between individual encoders. Instead of traversing
  // a graph we encode the attributes in multiple iterations where encoding of
  // attributes that depend on other attributes may get postponed until the
  // parent attributes are processed.
  // This is simpler to implement than graph traversal and it automatically
  // detects any cycles in the dependency graph.
  // TODO(ostava): Current implementation needs to encode all attributes of a
  // single encoder to be encoded in a single "chunk", therefore we need to sort
  // attribute encoders before we sort individual attributes. This requirement
  // can be lifted for encoders that can encode individual attributes separately
  // but it will require changes in the current API.
  attributes_encoder_ids_order_.resize(attributes_encoders_.size());
  std::vector<bool> is_encoder_processed(attributes_encoders_.size(), false);
  uint32_t num_processed_encoders = 0;
  while (num_processed_encoders < attributes_encoders_.size()) {
    // Flagged when any of the encoder get processed.
    bool encoder_processed = false;
    for (uint32_t i = 0; i < attributes_encoders_.size(); ++i) {
      if (is_encoder_processed[i]) {
        continue;  // Encoder already processed.
      }
      // Check if all parent encoders are already processed.
      bool can_be_processed = true;
      for (uint32_t p = 0; p < attributes_encoders_[i]->num_attributes(); ++p) {
        const int32_t att_id = attributes_encoders_[i]->GetAttributeId(p);
        for (int ap = 0;
             ap < attributes_encoders_[i]->NumParentAttributes(att_id); ++ap) {
          const uint32_t parent_att_id =
              attributes_encoders_[i]->GetParentAttributeId(att_id, ap);
          const int32_t parent_encoder_id =
              attribute_to_encoder_map_[parent_att_id];
          if (parent_att_id != i && !is_encoder_processed[parent_encoder_id]) {
            can_be_processed = false;
            break;
          }
        }
      }
      if (!can_be_processed) {
        continue;  // Try to process the encoder in the next iteration.
      }
      // Encoder can be processed. Update the encoding order.
      attributes_encoder_ids_order_[num_processed_encoders++] = i;
      is_encoder_processed[i] = true;
      encoder_processed = true;
    }
    if (!encoder_processed &&
        num_processed_encoders < attributes_encoders_.size()) {
      // No encoder was processed but there are still some remaining unprocessed
      // encoders.
      return false;
    }
  }

  // Now for every encoder, reorder the attributes to satisfy their
  // dependencies (an attribute may still depend on other attributes within an
  // encoder).
  std::vector<int32_t> attribute_encoding_order;
  std::vector<bool> is_attribute_processed(point_cloud_->num_attributes(),
                                           false);
  int num_processed_attributes;
  for (uint32_t ae_order = 0; ae_order < attributes_encoders_.size();
       ++ae_order) {
    const int ae = attributes_encoder_ids_order_[ae_order];
    const int32_t num_encoder_attributes =
        attributes_encoders_[ae]->num_attributes();
    if (num_encoder_attributes < 2) {
      continue;  // No need to resolve dependencies for a single attribute.
    }
    num_processed_attributes = 0;
    attribute_encoding_order.resize(num_encoder_attributes);
    while (num_processed_attributes < num_encoder_attributes) {
      // Flagged when any of the attributes get processed.
      bool attribute_processed = false;
      for (int i = 0; i < num_encoder_attributes; ++i) {
        const int32_t att_id = attributes_encoders_[ae]->GetAttributeId(i);
        if (is_attribute_processed[i]) {
          continue;  // Attribute already processed.
        }
        // Check if all parent attributes are already processed.
        bool can_be_processed = true;
        for (int p = 0;
             p < attributes_encoders_[ae]->NumParentAttributes(att_id); ++p) {
          const int32_t parent_att_id =
              attributes_encoders_[ae]->GetParentAttributeId(att_id, p);
          if (!is_attribute_processed[parent_att_id]) {
            can_be_processed = false;
            break;
          }
        }
        if (!can_be_processed) {
          continue;  // Try to process the attribute in the next iteration.
        }
        // Attribute can be processed. Update the encoding order.
        attribute_encoding_order[num_processed_attributes++] = i;
        is_attribute_processed[i] = true;
        attribute_processed = true;
      }
      if (!attribute_processed &&
          num_processed_attributes < num_encoder_attributes) {
        // No attribute was processed but there are still some remaining
        // unprocessed attributes.
        return false;
      }
    }
    // Update the order of the attributes within the encoder.
    attributes_encoders_[ae]->SetAttributeIds(attribute_encoding_order);
  }
  return true;
}